

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAiger.c
# Opt level: O2

Vec_Str_t *
Gia_AigerWriteIntoMemoryStrPart
          (Gia_Man_t *p,Vec_Int_t *vCis,Vec_Int_t *vAnds,Vec_Int_t *vCos,int nRegs)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  Vec_Str_t *p_00;
  long lVar6;
  uint uVar7;
  long lVar8;
  
  p->pObjs->Value = 0;
  for (uVar7 = 1; (int)(uVar7 - 1) < vCis->nSize; uVar7 = uVar7 + 1) {
    iVar1 = Vec_IntEntry(vCis,uVar7 - 1);
    pGVar5 = Gia_ManObj(p,iVar1);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x9fffffff) != 0) {
      __assert_fail("Gia_ObjIsCi(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAiger.c"
                    ,0x3f3,
                    "Vec_Str_t *Gia_AigerWriteIntoMemoryStrPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    pGVar5->Value = uVar7;
  }
  for (iVar1 = 0; iVar1 < vAnds->nSize; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(vAnds,iVar1);
    pGVar5 = Gia_ManObj(p,iVar2);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if (((int)(uint)*(undefined8 *)pGVar5 < 0) ||
       (((uint)*(undefined8 *)pGVar5 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAiger.c"
                    ,0x3f8,
                    "Vec_Str_t *Gia_AigerWriteIntoMemoryStrPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    pGVar5->Value = uVar7 + iVar1;
  }
  p_00 = Vec_StrAlloc(p->nObjs * 3);
  Vec_StrPrintStr(p_00,"aig ");
  Vec_StrPrintNum(p_00,vAnds->nSize + vCis->nSize);
  Vec_StrPrintStr(p_00," ");
  Vec_StrPrintNum(p_00,vCis->nSize - nRegs);
  Vec_StrPrintStr(p_00," ");
  Vec_StrPrintNum(p_00,nRegs);
  Vec_StrPrintStr(p_00," ");
  Vec_StrPrintNum(p_00,vCos->nSize - nRegs);
  Vec_StrPrintStr(p_00," ");
  Vec_StrPrintNum(p_00,vAnds->nSize);
  Vec_StrPrintStr(p_00,"\n");
  for (iVar1 = 0; iVar1 < vCos->nSize; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(vCos,iVar1);
    pGVar5 = Gia_ManObj(p,iVar2);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar7 = (uint)*(undefined8 *)pGVar5;
    if ((-1 < (int)uVar7) || ((uVar7 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsCo(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAiger.c"
                    ,0x40d,
                    "Vec_Str_t *Gia_AigerWriteIntoMemoryStrPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    if (vCos->nSize - nRegs <= iVar1) {
      iVar2 = Abc_Var2Lit(pGVar5[-(ulong)(uVar7 & 0x1fffffff)].Value,uVar7 >> 0x1d & 1);
      Vec_StrPrintNum(p_00,iVar2);
      Vec_StrPrintStr(p_00,"\n");
    }
  }
  for (iVar1 = 0; iVar1 < vCos->nSize; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(vCos,iVar1);
    pGVar5 = Gia_ManObj(p,iVar2);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar7 = (uint)*(undefined8 *)pGVar5;
    if ((-1 < (int)uVar7) || ((uVar7 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsCo(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAiger.c"
                    ,0x417,
                    "Vec_Str_t *Gia_AigerWriteIntoMemoryStrPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    if (iVar1 < vCos->nSize - nRegs) {
      iVar2 = Abc_Var2Lit(pGVar5[-(ulong)(uVar7 & 0x1fffffff)].Value,uVar7 >> 0x1d & 1);
      Vec_StrPrintNum(p_00,iVar2);
      Vec_StrPrintStr(p_00,"\n");
    }
  }
  for (iVar1 = 0; iVar1 < vAnds->nSize; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(vAnds,iVar1);
    pGVar5 = Gia_ManObj(p,iVar2);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar2 = Abc_Var2Lit(pGVar5->Value,0);
    uVar7 = Abc_Var2Lit(pGVar5[-(*(ulong *)pGVar5 & 0x1fffffff)].Value,
                        (uint)(*(ulong *)pGVar5 >> 0x1d) & 1);
    uVar3 = Abc_Var2Lit(pGVar5[-(*(ulong *)pGVar5 >> 0x20 & 0x1fffffff)].Value,
                        (uint)(*(ulong *)pGVar5 >> 0x3d) & 1);
    if (uVar7 == uVar3) {
      __assert_fail("uLit0 != uLit1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAiger.c"
                    ,0x425,
                    "Vec_Str_t *Gia_AigerWriteIntoMemoryStrPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    uVar4 = uVar3;
    if (uVar3 < uVar7) {
      uVar4 = uVar7;
    }
    Gia_AigerWriteUnsigned(p_00,iVar2 - uVar4);
    lVar6 = (ulong)uVar7 - (ulong)uVar3;
    lVar8 = -lVar6;
    if (0 < lVar6) {
      lVar8 = lVar6;
    }
    Gia_AigerWriteUnsigned(p_00,(uint)lVar8);
  }
  Vec_StrPrintStr(p_00,"c");
  return p_00;
}

Assistant:

Vec_Str_t * Gia_AigerWriteIntoMemoryStrPart( Gia_Man_t * p, Vec_Int_t * vCis, Vec_Int_t * vAnds, Vec_Int_t * vCos, int nRegs )
{
    Vec_Str_t * vBuffer;
    Gia_Obj_t * pObj;
    int nNodes = 0, i, uLit, uLit0, uLit1; 
    // set the node numbers to be used in the output file
    Gia_ManConst0(p)->Value = nNodes++;
    Gia_ManForEachObjVec( vCis, p, pObj, i )
    {
        assert( Gia_ObjIsCi(pObj) );
        pObj->Value = nNodes++;
    }
    Gia_ManForEachObjVec( vAnds, p, pObj, i )
    {
        assert( Gia_ObjIsAnd(pObj) );
        pObj->Value = nNodes++;
    }

    // write the header "M I L O A" where M = I + L + A
    vBuffer = Vec_StrAlloc( 3*Gia_ManObjNum(p) );
    Vec_StrPrintStr( vBuffer, "aig " );
    Vec_StrPrintNum( vBuffer, Vec_IntSize(vCis) + Vec_IntSize(vAnds) );
    Vec_StrPrintStr( vBuffer, " " );
    Vec_StrPrintNum( vBuffer, Vec_IntSize(vCis) - nRegs );
    Vec_StrPrintStr( vBuffer, " " );
    Vec_StrPrintNum( vBuffer, nRegs );
    Vec_StrPrintStr( vBuffer, " " );
    Vec_StrPrintNum( vBuffer, Vec_IntSize(vCos) - nRegs );
    Vec_StrPrintStr( vBuffer, " " );
    Vec_StrPrintNum( vBuffer, Vec_IntSize(vAnds) );
    Vec_StrPrintStr( vBuffer, "\n" );

    // write latch drivers
    Gia_ManForEachObjVec( vCos, p, pObj, i )
    {
        assert( Gia_ObjIsCo(pObj) );
        if ( i < Vec_IntSize(vCos) - nRegs )
            continue;
        uLit = Abc_Var2Lit( Gia_ObjValue(Gia_ObjFanin0(pObj)), Gia_ObjFaninC0(pObj) );
        Vec_StrPrintNum( vBuffer, uLit );
        Vec_StrPrintStr( vBuffer, "\n" );
    }
    // write output drivers
    Gia_ManForEachObjVec( vCos, p, pObj, i )
    {
        assert( Gia_ObjIsCo(pObj) );
        if ( i >= Vec_IntSize(vCos) - nRegs )
            continue;
        uLit = Abc_Var2Lit( Gia_ObjValue(Gia_ObjFanin0(pObj)), Gia_ObjFaninC0(pObj) );
        Vec_StrPrintNum( vBuffer, uLit );
        Vec_StrPrintStr( vBuffer, "\n" );
    }

    // write the nodes into the buffer
    Gia_ManForEachObjVec( vAnds, p, pObj, i )
    {
        uLit  = Abc_Var2Lit( Gia_ObjValue(pObj), 0 );
        uLit0 = Abc_Var2Lit( Gia_ObjValue(Gia_ObjFanin0(pObj)), Gia_ObjFaninC0(pObj) );
        uLit1 = Abc_Var2Lit( Gia_ObjValue(Gia_ObjFanin1(pObj)), Gia_ObjFaninC1(pObj) );
        assert( uLit0 != uLit1 );
        if ( uLit0 > uLit1 )
        {
            int Temp = uLit0;
            uLit0 = uLit1;
            uLit1 = Temp;
        }
        Gia_AigerWriteUnsigned( vBuffer, uLit  - uLit1 );
        Gia_AigerWriteUnsigned( vBuffer, uLit1 - uLit0 );
    }
    Vec_StrPrintStr( vBuffer, "c" );
    return vBuffer;
}